

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirePdu.cpp
# Opt level: O0

bool __thiscall DIS::FirePdu::operator==(FirePdu *this,FirePdu *rhs)

{
  bool bVar1;
  bool local_19;
  bool ivarsEqual;
  FirePdu *rhs_local;
  FirePdu *this_local;
  
  local_19 = WarfareFamilyPdu::operator==
                       (&this->super_WarfareFamilyPdu,&rhs->super_WarfareFamilyPdu);
  bVar1 = EntityID::operator==(&this->_munitionExpendibleID,&rhs->_munitionExpendibleID);
  if (!bVar1) {
    local_19 = false;
  }
  bVar1 = EventIdentifier::operator==(&this->_eventID,&rhs->_eventID);
  if (!bVar1) {
    local_19 = false;
  }
  if (this->_fireMissionIndex != rhs->_fireMissionIndex) {
    local_19 = false;
  }
  bVar1 = Vector3Double::operator==
                    (&this->_locationInWorldCoordinates,&rhs->_locationInWorldCoordinates);
  if (!bVar1) {
    local_19 = false;
  }
  bVar1 = MunitionDescriptor::operator==(&this->_descriptor,&rhs->_descriptor);
  if (!bVar1) {
    local_19 = false;
  }
  bVar1 = Vector3Float::operator==(&this->_velocity,&rhs->_velocity);
  if (!bVar1) {
    local_19 = false;
  }
  if ((this->_range != rhs->_range) || (NAN(this->_range) || NAN(rhs->_range))) {
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool FirePdu::operator ==(const FirePdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = WarfareFamilyPdu::operator==(rhs);

     if( ! (_munitionExpendibleID == rhs._munitionExpendibleID) ) ivarsEqual = false;
     if( ! (_eventID == rhs._eventID) ) ivarsEqual = false;
     if( ! (_fireMissionIndex == rhs._fireMissionIndex) ) ivarsEqual = false;
     if( ! (_locationInWorldCoordinates == rhs._locationInWorldCoordinates) ) ivarsEqual = false;
     if( ! (_descriptor == rhs._descriptor) ) ivarsEqual = false;
     if( ! (_velocity == rhs._velocity) ) ivarsEqual = false;
     if( ! (_range == rhs._range) ) ivarsEqual = false;

    return ivarsEqual;
 }